

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O1

void __thiscall
cmLocalUnixMakefileGenerator3::ComputeHomeRelativeOutputPath(cmLocalUnixMakefileGenerator3 *this)

{
  int iVar1;
  string *psVar2;
  string local_38;
  
  psVar2 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  cmOutputConverter::MaybeRelativeToTopBinDir
            (&local_38,
             &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
             psVar2);
  psVar2 = &this->HomeRelativeOutputPath;
  std::__cxx11::string::operator=((string *)psVar2,(string *)&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  iVar1 = std::__cxx11::string::compare((char *)psVar2);
  if (iVar1 == 0) {
    (this->HomeRelativeOutputPath)._M_string_length = 0;
    *(this->HomeRelativeOutputPath)._M_dataplus._M_p = '\0';
  }
  if ((this->HomeRelativeOutputPath)._M_string_length != 0) {
    std::__cxx11::string::append((char *)psVar2);
  }
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::ComputeHomeRelativeOutputPath()
{
  // Compute the path to use when referencing the current output
  // directory from the top output directory.
  this->HomeRelativeOutputPath =
    this->MaybeRelativeToTopBinDir(this->GetCurrentBinaryDirectory());
  if (this->HomeRelativeOutputPath == ".") {
    this->HomeRelativeOutputPath.clear();
  }
  if (!this->HomeRelativeOutputPath.empty()) {
    this->HomeRelativeOutputPath += "/";
  }
}